

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O1

void __thiscall libtorrent::dht::find_data_observer::reply(find_data_observer *this,msg *m)

{
  find_data *this_00;
  bool bVar1;
  int iVar2;
  uint *puVar3;
  dht_observer *pdVar4;
  string_view sVar5;
  string_view key;
  string_view key_00;
  bdecode_node id;
  bdecode_node token;
  bdecode_node r;
  node_id local_118;
  string local_100;
  bdecode_node local_e0;
  bdecode_node local_a0;
  bdecode_node local_60;
  
  sVar5._M_str = "r";
  sVar5._M_len = 1;
  bdecode_node::dict_find_dict(&local_60,m->message,sVar5);
  bVar1 = bdecode_node::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    pdVar4 = observer::get_observer((observer *)this);
    (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
              (pdVar4,4,"[%u] missing response dict",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    (*(this->super_traversal_observer).super_observer._vptr_observer[3])(this);
    goto LAB_003c0261;
  }
  key._M_str = "id";
  key._M_len = 2;
  bdecode_node::dict_find_string(&local_e0,&local_60,key);
  bVar1 = bdecode_node::operator_cast_to_bool(&local_e0);
  if (bVar1) {
    iVar2 = bdecode_node::string_length(&local_e0);
    if (iVar2 != 0x14) goto LAB_003c021a;
    key_00._M_str = "token";
    key_00._M_len = 5;
    bdecode_node::dict_find_string(&local_a0,&local_60,key_00);
    bVar1 = bdecode_node::operator_cast_to_bool(&local_a0);
    if (bVar1) {
      this_00 = (find_data *)
                (this->super_traversal_observer).super_observer.m_algorithm.
                super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      puVar3 = (uint *)bdecode_node::string_ptr(&local_e0);
      if (puVar3 == (uint *)0x0) {
        local_118.m_number._M_elems[0] = 0;
        local_118.m_number._M_elems[1] = 0;
        local_118.m_number._M_elems[2] = 0;
        local_118.m_number._M_elems[3] = 0;
        local_118.m_number._M_elems[4] = 0;
      }
      else {
        local_118.m_number._M_elems[4] = puVar3[4];
        local_118.m_number._M_elems._0_8_ = *(undefined8 *)puVar3;
        local_118.m_number._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
      }
      sVar5 = bdecode_node::string_value(&local_a0);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,sVar5._M_str,sVar5._M_str + sVar5._M_len);
      find_data::got_write_token(this_00,&local_118,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    traversal_observer::reply(&this->super_traversal_observer,m);
    observer::done((observer *)this);
    if (local_a0.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_003c021a:
    pdVar4 = observer::get_observer((observer *)this);
    (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
              (pdVar4,4,"[%u] invalid id in response",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    (*(this->super_traversal_observer).super_observer._vptr_observer[3])(this);
  }
  if (local_e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_003c0261:
  if (local_60.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find_data_observer::reply(msg const& m)
{
	bdecode_node const r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] invalid id in response"
			, algorithm()->id());
#endif
		timeout();
		return;
	}
	bdecode_node const token = r.dict_find_string("token");
	if (token)
	{
		static_cast<find_data*>(algorithm())->got_write_token(
			node_id(id.string_ptr()), std::string(token.string_value()));
	}

	traversal_observer::reply(m);
	done();
}